

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::StdString::RegexMatcher::match(RegexMatcher *this,string *matchee)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  regex reg;
  flag_type flags;
  syntax_option_type in_stack_ffffffffffffff9c;
  syntax_option_type *in_stack_ffffffffffffffa0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  flag_type in_stack_ffffffffffffffd4;
  element_type *in_stack_ffffffffffffffd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe0;
  
  if (*(int *)&in_RDI[2].field_2 == 1) {
    clara::std::regex_constants::operator|=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  this_00 = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&stack0xffffffffffffffc8;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffffe0._M_pi
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (in_RDI,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                     (match_flag_type)((ulong)this_00 >> 0x20));
  clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool RegexMatcher::match(std::string const& matchee) const {
            auto flags = std::regex::ECMAScript; // ECMAScript is the default syntax option anyway
            if (m_caseSensitivity == CaseSensitive::Choice::No) {
                flags |= std::regex::icase;
            }
            auto reg = std::regex(m_regex, flags);
            return std::regex_match(matchee, reg);
        }